

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O2

Var * __thiscall kratos::Var::get_size_param(Var *this,uint32_t index)

{
  const_iterator cVar1;
  mapped_type *ppVVar2;
  mapped_type pVVar3;
  key_type local_14 [2];
  uint32_t index_local;
  
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->size_param_)._M_h,local_14);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    pVVar3 = (Var *)0x0;
  }
  else {
    ppVVar2 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->size_param_,local_14);
    pVVar3 = *ppVVar2;
  }
  return pVVar3;
}

Assistant:

inline Var *get_size_param(uint32_t index) const {
        return size_param_.find(index) == size_param_.end() ? nullptr : size_param_.at(index);
    }